

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# builtin_upper_bounds.cpp
# Opt level: O1

void __thiscall
despot::MDPUpperBound::MDPUpperBound(MDPUpperBound *this,MDP *model,StateIndexer *indexer)

{
  vector<despot::ValuedAction,_std::allocator<despot::ValuedAction>_> *__x;
  
  ParticleUpperBound::ParticleUpperBound(&this->super_ParticleUpperBound);
  BeliefUpperBound::BeliefUpperBound(&this->super_BeliefUpperBound);
  (this->super_ParticleUpperBound).super_ScenarioUpperBound._vptr_ScenarioUpperBound =
       (_func_int **)&PTR__MDPUpperBound_00190608;
  (this->super_BeliefUpperBound)._vptr_BeliefUpperBound = (_func_int **)&PTR__MDPUpperBound_00190648
  ;
  this->model_ = model;
  this->indexer_ = indexer;
  (this->policy_).super__Vector_base<despot::ValuedAction,_std::allocator<despot::ValuedAction>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->policy_).super__Vector_base<despot::ValuedAction,_std::allocator<despot::ValuedAction>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->policy_).super__Vector_base<despot::ValuedAction,_std::allocator<despot::ValuedAction>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (*model->_vptr_MDP[6])(model);
  __x = MDP::policy(this->model_);
  std::vector<despot::ValuedAction,_std::allocator<despot::ValuedAction>_>::operator=
            (&this->policy_,__x);
  return;
}

Assistant:

MDPUpperBound::MDPUpperBound(const MDP* model,
	const StateIndexer& indexer) :
	model_(model),
	indexer_(indexer) {
	const_cast<MDP*>(model_)->ComputeOptimalPolicyUsingVI();
	policy_ = model_->policy();
}